

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void __thiscall rsg::Shader::tokenize(Shader *this,GeneratorState *state,TokenStream *str)

{
  Statement *pSVar1;
  TokenStream *pTVar2;
  ulong uVar3;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  
  if (state->m_shader->m_type == TYPE_FRAGMENT) {
    local_78.m_type = PRECISION;
    pTVar2 = TokenStream::operator<<(str,&local_78);
    local_38.m_type = MEDIUM_PRECISION;
    pTVar2 = TokenStream::operator<<(pTVar2,&local_38);
    local_48.m_type = FLOAT;
    pTVar2 = TokenStream::operator<<(pTVar2,&local_48);
    local_58.m_type = SEMICOLON;
    pTVar2 = TokenStream::operator<<(pTVar2,&local_58);
    local_68.m_type = NEWLINE;
    TokenStream::operator<<(pTVar2,&local_68);
    Token::~Token(&local_68);
    Token::~Token(&local_58);
    Token::~Token(&local_48);
    Token::~Token(&local_38);
    Token::~Token(&local_78);
  }
  uVar3 = (ulong)((long)(this->m_globalStatements).
                        super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_globalStatements).
                       super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    if ((int)(uint)uVar3 < 0) break;
    pSVar1 = (this->m_globalStatements).
             super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)uVar3 & 0x7fffffff];
    (*pSVar1->_vptr_Statement[3])(pSVar1,state,str);
  }
  uVar3 = (ulong)((long)(this->m_functions).
                        super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_functions).
                       super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl
                       .super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    if ((int)(uint)uVar3 < 0) break;
    local_78.m_type = NEWLINE;
    TokenStream::operator<<(str,&local_78);
    Token::~Token(&local_78);
    Function::tokenize((this->m_functions).
                       super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl
                       .super__Vector_impl_data._M_start[(uint)uVar3 & 0x7fffffff],state,str);
  }
  local_78.m_type = NEWLINE;
  TokenStream::operator<<(str,&local_78);
  Token::~Token(&local_78);
  Function::tokenize(&this->m_mainFunction,state,str);
  return;
}

Assistant:

void Shader::tokenize (GeneratorState& state, TokenStream& str) const
{
	// Add default precision for float in fragment shaders \todo [pyry] Proper precision handling
	if (state.getShader().getType() == Shader::TYPE_FRAGMENT)
		str << Token::PRECISION << Token::MEDIUM_PRECISION << Token::FLOAT << Token::SEMICOLON << Token::NEWLINE;

	// Tokenize global declaration statements
	for (int ndx = (int)m_globalStatements.size()-1; ndx >= 0; ndx--)
		m_globalStatements[ndx]->tokenize(state, str);

	// Tokenize all functions
	for (int ndx = (int)m_functions.size()-1; ndx >= 0; ndx--)
	{
		str << Token::NEWLINE;
		m_functions[ndx]->tokenize(state, str);
	}

	// Tokenize main
	str << Token::NEWLINE;
	m_mainFunction.tokenize(state, str);
}